

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,TPZVec<double> *pt,
          TPZFMatrix<Fad<double>_> *directions)

{
  double *pdVar1;
  long row;
  int j;
  long col;
  TPZFNMatrix<9,_double> gradx;
  TPZFNMatrix<9,_Fad<double>_> gradxFad;
  TPZFNMatrix<9,_double> gradxinv;
  TPZManVector<Fad<double>,_10> qsiFad;
  
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,2,(double *)&gradxFad);
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradxinv,2,2,(double *)&gradxFad);
  (**(code **)(*(long *)&this->super_TPZGeoEl + 0x230))(this,pt,&gradx);
  TPZFMatrix<double>::Resize(&gradx.super_TPZFMatrix<double>,2,2);
  TPZMatrix<double>::Inverse
            ((TPZMatrix<double> *)&gradx,&gradxinv.super_TPZFMatrix<double>,ENoDecompose);
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow.
  _0_4_ = 0;
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0
  ;
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  gradxFad.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ =
       0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&qsiFad,2,(Fad<double> *)&gradxFad);
  Fad<double>::~Fad((Fad<double> *)&gradxFad);
  for (row = 0; row != 2; row = row + 1) {
    Fad<double>::Fad((Fad<double> *)&gradxFad,2,pt->fStore + row);
    Fad<double>::operator=(qsiFad.super_TPZVec<Fad<double>_>.fStore + row,(Fad<double> *)&gradxFad);
    Fad<double>::~Fad((Fad<double> *)&gradxFad);
    for (col = 0; col != 2; col = col + 1) {
      pdVar1 = TPZFMatrix<double>::operator()(&gradxinv.super_TPZFMatrix<double>,row,col);
      qsiFad.super_TPZVec<Fad<double>_>.fStore[row].dx_.ptr_to_data[col] = *pdVar1;
    }
  }
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&gradxFad,3,2);
  (**(code **)(*(long *)&this->super_TPZGeoEl + 0x240))(this,&qsiFad,&gradxFad);
  pztopology::TPZTriangle::ComputeHDivDirections<Fad<double>>
            (&gradxFad.super_TPZFMatrix<Fad<double>_>,directions);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&gradxFad);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&qsiFad);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradxinv);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<Fad<REAL>> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.),gradxinv(TGeo::Dimension,TGeo::Dimension,0.);
    
    this->GradX(pt, gradx);
    gradx.Resize(TGeo::Dimension,TGeo::Dimension);
    gradx.Inverse(gradxinv, ENoDecompose);
    
    TPZManVector<Fad<REAL>> qsiFad(TGeo::Dimension,0.);
    
    for(int i=0;i<TGeo::Dimension;i++){
        qsiFad[i] = Fad<REAL>(TGeo::Dimension,pt[i]);

        for(int j=0;j<TGeo::Dimension;j++){
            qsiFad[i].fastAccessDx(j)=gradxinv(i,j);
        }
    }
    //std::cout<<qsiFad<<std::endl;
    TPZFNMatrix<9,Fad<REAL>> gradxFad(3,TGeo::Dimension);
    this->GradX(qsiFad, gradxFad);
    //gradxFad.Print(std::cout);
    TGeo::ComputeHDivDirections(gradxFad, directions);
   
}